

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseF32(WastParser *this,Const *const_,ConstType const_type)

{
  Result RVar1;
  ExpectedNan expected;
  uint32_t f32_bits;
  Token token;
  ExpectedNan local_60;
  uint32_t local_5c;
  Token local_58;
  
  if ((const_type == Expectation) && (RVar1 = ParseExpectedNan(this,&local_60), RVar1.enum_ == Ok))
  {
    (const_->type_).enum_ = F32;
    (const_->type_).type_index_ = 0xffffffff;
    (const_->data_).v[0] = '\0';
    (const_->data_).v[1] = '\0';
    (const_->data_).v[2] = '\0';
    (const_->data_).v[3] = '\0';
    const_->nan_[0] = local_60;
    return (Result)Ok;
  }
  Consume(&local_58,this);
  RVar1.enum_ = Error;
  if (local_58.token_type_ - First_Literal < 3) {
    RVar1 = ParseFloat(local_58.field_2.literal_.type,local_58.field_2.literal_.text._M_str,
                       local_58.field_2.text_._M_str + (long)local_58.field_2.literal_.text._M_str,
                       &local_5c);
    (const_->type_).enum_ = F32;
    (const_->type_).type_index_ = 0xffffffff;
    *(uint32_t *)(const_->data_).v = local_5c;
    const_->nan_[0] = None;
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result WastParser::ParseF32(Const* const_, ConstType const_type) {
  ExpectedNan expected;
  if (const_type == ConstType::Expectation &&
      Succeeded(ParseExpectedNan(&expected))) {
    const_->set_f32(expected);
    return Result::Ok;
  }

  auto token = Consume();
  if (!token.HasLiteral()) {
    return Result::Error;
  }

  auto literal = token.literal();
  uint32_t f32_bits;
  Result result = ParseFloat(literal.type, literal.text, &f32_bits);
  const_->set_f32(f32_bits);
  return result;
}